

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCLattice.cpp
# Opt level: O0

void __thiscall OpenMD::SCLattice::update(SCLattice *this)

{
  Vector<double,_3U> *pVVar1;
  double *pdVar2;
  long in_RDI;
  double dVar3;
  RealType oneOverRoot3;
  
  dVar3 = sqrt(3.0);
  dVar3 = 1.0 / dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = dVar3;
  return;
}

Assistant:

void SCLattice::update() {
    RealType oneOverRoot3;
    oneOverRoot3 = 1.0 / sqrt(3.0);

    // Molecule 1
    cellSitesPos[0][0] = 0.0;
    cellSitesPos[0][1] = 0.0;
    cellSitesPos[0][2] = 0.0;

    cellSitesOrt[0][0] = oneOverRoot3;
    cellSitesOrt[0][1] = oneOverRoot3;
    cellSitesOrt[0][2] = oneOverRoot3;
  }